

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_parser.cpp
# Opt level: O2

bool __thiscall duckdb::SQLLogicParser::OpenFile(SQLLogicParser *this,string *path)

{
  istream *piVar1;
  bool bVar2;
  allocator local_2da;
  allocator local_2d9;
  string line;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream infile;
  byte abStack_218 [488];
  
  std::__cxx11::string::_M_assign((string *)this);
  std::ifstream::ifstream(&infile,(string *)this,_S_in);
  if ((abStack_218[*(long *)(_infile + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&infile,(string *)&line);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::string::string(local_278,(string *)&line);
      std::__cxx11::string::string(local_298,"\r",&local_2d9);
      std::__cxx11::string::string(local_2b8,anon_var_dwarf_889e57 + 9,&local_2da);
      duckdb::StringUtil::Replace(&local_258,local_278,local_298,local_2b8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->lines,
                 &local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string(local_2b8);
      std::__cxx11::string::~string(local_298);
      std::__cxx11::string::~string(local_278);
    }
    bVar2 = (abStack_218[*(long *)(_infile + -0x18)] & 1) == 0;
    std::__cxx11::string::~string((string *)&line);
  }
  else {
    bVar2 = false;
  }
  std::ifstream::~ifstream(&infile);
  return bVar2;
}

Assistant:

bool SQLLogicParser::OpenFile(const string &path) {
	this->file_name = path;

	std::ifstream infile(file_name);
	if (infile.bad() || infile.fail()) {
		return false;
	}

	string line;
	while (std::getline(infile, line)) {
		lines.push_back(StringUtil::Replace(line, "\r", ""));
	}
	return !infile.bad();
}